

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
                  *this,int opcode)

{
  Kind KVar1;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar2;
  uint uVar3;
  int iVar4;
  AssertionFailure *this_00;
  char *pcVar5;
  MockNLHandler *this_01;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  local_28.field_1.values_ = (Value *)&local_38;
  if (0x52 < (uint)opcode) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid opcode");
LAB_001c7c67:
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  KVar1 = OpCodeInfo::INFO[(uint)opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 == NOT) {
      this_01 = &this->handler_->super_MockNLHandler;
      ReadLogicalExpr(this);
      pcVar5 = "logical not";
    }
    else if (KVar1 == FIRST_BINARY_LOGICAL) {
      ReadLogicalExpr(this);
      ReadLogicalExpr(this);
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar5 = "binary logical expression";
    }
    else {
      if (KVar1 != FIRST_RELATIONAL) goto switchD_001c7a7b_caseD_3c;
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      ReadNumericExpr(this,*pcVar5,false);
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      ReadNumericExpr(this,*pcVar5,false);
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar5 = "relational expression";
    }
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      ReadNumericExpr(this,*pcVar5,false);
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      if (*pcVar5 == 'o') {
        uVar3 = ReadOpCode(this);
        if (0x52 < uVar3) {
          this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
          AssertionFailure::AssertionFailure(this_00,"invalid opcode");
          goto LAB_001c7c67;
        }
        if (OpCodeInfo::INFO[uVar3].kind == COUNT) {
          this_01 = &this->handler_->super_MockNLHandler;
          ReadCountExpr(this);
          pcVar5 = "logical count expression";
          break;
        }
      }
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      local_28.field_1.values_ = (Value *)&local_38;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x2637d2,&local_28);
    default:
switchD_001c7a7b_caseD_3c:
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x265232,&local_28);
    case IMPLICATION:
      ReadLogicalExpr(this);
      ReadLogicalExpr(this);
      ReadLogicalExpr(this);
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar5 = "implication expression";
      break;
    case EXISTS:
      iVar4 = ReadNumArgs(this,3);
      MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"iterated logical expression")
      ;
      if (0 < iVar4) {
        do {
          ReadLogicalExpr(this);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar5 = "iterated logical expression";
      break;
    case ALLDIFF:
      iVar4 = ReadNumArgs(this,1);
      MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"pairwise expression");
      if (0 < iVar4) {
        do {
          pBVar2 = this->reader_;
          pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
          ReadNumericExpr(this,*pcVar5,false);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      this_01 = &this->handler_->super_MockNLHandler;
      pcVar5 = "pairwise expression";
    }
  }
  MockNLHandler::OnUnhandled(this_01,pcVar5);
  return (LogicalExpr)NULL_ID;
}

Assistant:

fmt::StringRef ReadString() {
    int length = ReadUInt();
    return fmt::StringRef(length != 0 ? Read(length) : 0, length);
  }